

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

ggml_tensor *
build_rope_2d(ggml_context *ctx0,ggml_tensor *cur,ggml_tensor *pos_h,ggml_tensor *pos_w,
             float freq_base)

{
  long lVar1;
  int64_t iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  ggml_tensor *pgVar7;
  ulong uVar8;
  float fVar9;
  
  lVar6 = cur->ne[0];
  lVar1 = cur->ne[1];
  iVar2 = cur->ne[2];
  fVar9 = powf(freq_base,-2.0 / (float)lVar6);
  uVar8 = lVar6 / 2;
  uVar3 = ggml_row_size(cur->type,lVar6);
  uVar4 = ggml_row_size(cur->type,lVar1 * lVar6);
  uVar3 = ggml_view_3d(ctx0,cur,uVar8,lVar1,iVar2,uVar3,uVar4,0);
  uVar3 = ggml_rope_ext(freq_base,0x3f800000,0,0x3f800000,0,0,ctx0,uVar3,pos_h,0,uVar8 & 0xffffffff,
                        0,0);
  uVar4 = ggml_row_size(cur->type,lVar6);
  uVar5 = ggml_row_size(cur->type,lVar1 * lVar6);
  lVar6 = ggml_element_size(cur);
  uVar4 = ggml_view_3d(ctx0,cur,uVar8,lVar1,iVar2,uVar4,uVar5,lVar6 * uVar8);
  uVar4 = ggml_cont(ctx0,uVar4);
  uVar4 = ggml_rope_ext(freq_base,fVar9,0,0x3f800000,0,0,ctx0,uVar4,pos_w,0,uVar8 & 0xffffffff,0,0);
  pgVar7 = (ggml_tensor *)ggml_concat(ctx0,uVar3,uVar4,0);
  return pgVar7;
}

Assistant:

static ggml_tensor * build_rope_2d(
    ggml_context * ctx0,
    ggml_tensor * cur,
    ggml_tensor * pos_h,
    ggml_tensor * pos_w,
    const float freq_base
) {
    const int64_t n_dim  = cur->ne[0];
    const int64_t n_head = cur->ne[1];
    const int64_t n_pos  = cur->ne[2];

    // for example, if we have cur tensor of shape (n_dim=8, n_head, n_pos)
    // we will have a list of 4 inv_freq: 1e-0, 1e-1, 1e-2, 1e-3
    // first half of cur will use 1e-0, 1e-2 (even)
    // second half of cur will use 1e-1, 1e-3 (odd)
    // the trick here is to rotate just half of n_dim, so inv_freq will automatically be even
    //  ^ don't ask me why, it's math! -2(2i) / n_dim == -2i / (n_dim/2)
    // then for the second half, we use freq_scale to shift the inv_freq
    //  ^ why? replace (2i) with (2i+1) in the above equation
    const float freq_scale_odd = std::pow(freq_base, (float)-2/n_dim);

    // first half
    ggml_tensor * first;
    {
        first = ggml_view_3d(ctx0, cur,
            n_dim/2, n_head, n_pos,
            ggml_row_size(cur->type, n_dim),
            ggml_row_size(cur->type, n_dim*n_head),
            0);
        first = ggml_rope_ext(
            ctx0,
            first,
            pos_h,      // positions
            nullptr,    // freq factors
            n_dim/2,    // n_dims
            0, 0, freq_base,
            1.0f, 0.0f, 1.0f, 0.0f, 0.0f
        );
    }

    // second half
    ggml_tensor * second;
    {
        second = ggml_view_3d(ctx0, cur,
            n_dim/2, n_head, n_pos,
            ggml_row_size(cur->type, n_dim),
            ggml_row_size(cur->type, n_dim*n_head),
            n_dim/2 * ggml_element_size(cur));
        second = ggml_cont(ctx0, second); // copy, because ggml_rope don't play well with non-contiguous tensors
        second = ggml_rope_ext(
            ctx0,
            second,
            pos_w,      // positions
            nullptr,    // freq factors
            n_dim/2,    // n_dims
            0, 0, freq_base,
            freq_scale_odd,
            0.0f, 1.0f, 0.0f, 0.0f
        );
    }

    cur = ggml_concat(ctx0, first, second, 0);
    return cur;
}